

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetAppBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  
  GetFullName(__return_storage_ptr__,this,config,RuntimeBinaryArtifact);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"BUNDLE_EXTENSION",&local_41);
  GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (((level - ContentLevel < 2) &&
      (bVar1 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile), !bVar1)) &&
     (std::__cxx11::string::append((char *)__return_storage_ptr__), level == FullLevel)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetAppBundleDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath =
    this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact);
  fpath += ".";
  const char* ext = this->GetProperty("BUNDLE_EXTENSION");
  if (!ext) {
    ext = "app";
  }
  fpath += ext;
  if (shouldAddContentLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Contents";
    if (shouldAddFullLevel(level)) {
      fpath += "/MacOS";
    }
  }
  return fpath;
}